

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O0

int __thiscall VMState::PopJNZInstructionWithTarget(VMState *this,int address)

{
  int iVar1;
  NutFunction *pNVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  const_iterator local_30;
  int local_24;
  int local_20;
  int pos;
  int i;
  int address_local;
  VMState *this_local;
  
  pos = address;
  _i = this;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->m_JNZInstructions);
  local_20 = (int)sVar3;
  do {
    local_20 = local_20 + -1;
    if (local_20 < 0) {
      return -1;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_JNZInstructions,(long)local_20);
    iVar1 = *pvVar4;
    pNVar2 = this->m_Parent;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_JNZInstructions,(long)local_20);
    pvVar5 = std::vector<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>::
             operator[](&pNVar2->m_Instructions,(long)*pvVar4);
  } while (iVar1 + 1 + (pvVar5->field_0).arg1 != pos);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->m_JNZInstructions,(long)local_20);
  local_24 = *pvVar4;
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&this->m_JNZInstructions);
  local_38 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                       (&local_40,(long)local_20);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_30,
             &local_38);
  std::vector<int,_std::allocator<int>_>::erase(&this->m_JNZInstructions,local_30);
  return local_24;
}

Assistant:

int PopJNZInstructionWithTarget( int address )
	{
		// Find last JNZ instruction that points at specified address (we need last to find
		// outermost do..while block)

		for( int i = (int)m_JNZInstructions.size() - 1; i >= 0; --i)
			if ((m_JNZInstructions[i] + 1 + m_Parent.m_Instructions[m_JNZInstructions[i]].arg1) == address)
			{
				int pos = m_JNZInstructions[i];
				m_JNZInstructions.erase(m_JNZInstructions.begin() + i);
				return pos;
			}

		return -1;
	}